

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

LY_ERR lyd_dup_r(lyd_node *node,ly_ctx *trg_ctx,lyd_node *parent,uint32_t insert_order,
                lyd_node **first,uint32_t options,lyd_node **dup_p)

{
  lysc_node **trg_schema;
  ly_ctx **pplVar1;
  ushort uVar2;
  uint uVar3;
  LY_VALUE_FORMAT LVar4;
  lysc_node *plVar5;
  lyd_attr *plVar6;
  lysc_node *type;
  bool bVar7;
  uint uVar8;
  LY_ERR LVar9;
  lyd_node_opaq *parent_00;
  lyd_attr *attr;
  lys_module *plVar10;
  lyd_attr *plVar11;
  lyd_node *plVar12;
  ly_ht *plVar13;
  int iVar14;
  size_t sVar15;
  lyd_meta *meta;
  long lVar16;
  
  uVar3 = node->flags;
  if ((uVar3 & 8) != 0) {
    if ((options & 0x10) != 0) {
      return LY_SUCCESS;
    }
    if (node->schema == (lysc_node *)0x0) {
      plVar10 = (lys_module *)&node[2].schema;
    }
    else {
      plVar10 = node->schema->module;
    }
    trg_ctx = plVar10->ctx;
  }
  plVar5 = node->schema;
  if (plVar5 == (lysc_node *)0x0) {
    parent_00 = (lyd_node_opaq *)calloc(1,0x80);
    parent_00->ctx = trg_ctx;
  }
  else {
    uVar2 = plVar5->nodetype;
    if (0x1f < uVar2) {
      if (uVar2 < 0x100) {
        if ((uVar2 == 0x20) || (uVar2 == 0x60)) goto LAB_00126133;
      }
      else if ((uVar2 == 0x100) || ((uVar2 == 0x400 || (uVar2 == 0x200)))) goto LAB_00126133;
LAB_0012654a:
      parent_00 = (lyd_node_opaq *)0x0;
      LVar9 = LY_EINT;
      ly_log(trg_ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c",
             0x810);
      goto LAB_00126737;
    }
    if (uVar2 < 8) {
      if (uVar2 == 1) goto LAB_00126133;
      if (uVar2 != 4) goto LAB_0012654a;
LAB_0012613f:
      sVar15 = 0x60;
    }
    else {
      if (uVar2 == 8) goto LAB_0012613f;
      if (uVar2 != 0x10) goto LAB_0012654a;
LAB_00126133:
      sVar15 = 0x48;
    }
    parent_00 = (lyd_node_opaq *)calloc(1,sVar15);
  }
  if (parent_00 == (lyd_node_opaq *)0x0) {
    parent_00 = (lyd_node_opaq *)0x0;
    LVar9 = LY_EMEM;
    ly_log(trg_ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_dup_r");
    goto LAB_00126737;
  }
  uVar8 = uVar3 & 9 | 4;
  if ((options & 8) != 0) {
    uVar8 = uVar3;
  }
  (parent_00->field_0).node.flags = uVar8;
  if ((options & 0x20) != 0) {
    (parent_00->field_0).node.priv = node->priv;
  }
  if (plVar5 == (lysc_node *)0x0) {
    plVar10 = (lys_module *)&node[2].schema;
  }
  else {
    plVar10 = plVar5->module;
  }
  trg_schema = &(parent_00->field_0).node.schema;
  if (trg_ctx == plVar10->ctx) {
    *trg_schema = plVar5;
  }
  else {
    LVar9 = lyd_find_schema_ctx(plVar5,trg_ctx,parent,'\x01',trg_schema);
    if (LVar9 != LY_SUCCESS) {
      free(parent_00);
      parent_00 = (lyd_node_opaq *)0x0;
      goto LAB_00126737;
    }
  }
  (parent_00->field_0).node.prev = (lyd_node *)parent_00;
  if ((options & 2) == 0) {
    if (node->schema == (lysc_node *)0x0) {
      lVar16._0_4_ = node[2].hash;
      lVar16._4_4_ = node[2].flags;
      if (lVar16 != 0) {
        pplVar1 = &parent_00->ctx;
        do {
          if ((parent_00->field_0).node.schema == (lysc_node *)0x0) {
            attr = (lyd_attr *)calloc(1,0x40);
            if (attr == (lyd_attr *)0x0) {
              bVar7 = false;
              LVar9 = LY_EMEM;
              ly_log(parent_00->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).");
            }
            else {
              LVar9 = lydict_insert(*pplVar1,*(char **)(lVar16 + 0x10),0,&(attr->name).name);
              if (LVar9 == LY_SUCCESS) {
                plVar5 = (parent_00->field_0).node.schema;
                plVar10 = (lys_module *)pplVar1;
                if (plVar5 != (lysc_node *)0x0) {
                  plVar10 = plVar5->module;
                }
                LVar9 = lydict_insert(plVar10->ctx,*(char **)(lVar16 + 0x18),0,&(attr->name).prefix)
                ;
                if (LVar9 != LY_SUCCESS) goto LAB_0012632e;
                plVar5 = (parent_00->field_0).node.schema;
                plVar10 = (lys_module *)pplVar1;
                if (plVar5 != (lysc_node *)0x0) {
                  plVar10 = plVar5->module;
                }
                LVar9 = lydict_insert(plVar10->ctx,*(char **)(lVar16 + 0x20),0,
                                      &(attr->name).field_2.module_ns);
                if (LVar9 != LY_SUCCESS) goto LAB_0012632e;
                plVar5 = (parent_00->field_0).node.schema;
                plVar10 = (lys_module *)pplVar1;
                if (plVar5 != (lysc_node *)0x0) {
                  plVar10 = plVar5->module;
                }
                LVar9 = lydict_insert(plVar10->ctx,*(char **)(lVar16 + 0x28),0,&attr->value);
                if (LVar9 != LY_SUCCESS) goto LAB_0012632e;
                attr->hints = *(uint32_t *)(lVar16 + 0x30);
                LVar4 = *(LY_VALUE_FORMAT *)(lVar16 + 0x34);
                attr->format = LVar4;
                if (*(void **)(lVar16 + 0x38) != (void *)0x0) {
                  plVar5 = (parent_00->field_0).node.schema;
                  plVar10 = (lys_module *)pplVar1;
                  if (plVar5 != (lysc_node *)0x0) {
                    plVar10 = plVar5->module;
                  }
                  LVar9 = ly_dup_prefix_data(plVar10->ctx,LVar4,*(void **)(lVar16 + 0x38),
                                             &attr->val_prefix_data);
                  if (LVar9 != LY_SUCCESS) goto LAB_0012632e;
                }
                attr->parent = parent_00;
                plVar6 = parent_00->attr;
                if (parent_00->attr == (lyd_attr *)0x0) {
                  parent_00->attr = attr;
                }
                else {
                  do {
                    plVar11 = plVar6;
                    plVar6 = plVar11->next;
                  } while (plVar6 != (lyd_attr *)0x0);
                  plVar11->next = attr;
                }
              }
              else {
LAB_0012632e:
                plVar5 = (parent_00->field_0).node.schema;
                plVar10 = (lys_module *)pplVar1;
                if (plVar5 != (lysc_node *)0x0) {
                  plVar10 = plVar5->module;
                }
                lyd_free_attr_single(plVar10->ctx,attr);
              }
              LVar9 = LY_SUCCESS;
              bVar7 = true;
            }
          }
          else {
            bVar7 = false;
            LVar9 = LY_EINVAL;
            ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","!node->schema",
                   "lyd_dup_attr_single");
          }
          if (!bVar7) goto LAB_00126737;
          lVar16 = *(long *)(lVar16 + 8);
        } while (lVar16 != 0);
      }
    }
    else {
      for (meta = node->meta; meta != (lyd_meta *)0x0; meta = meta->next) {
        LVar9 = lyd_dup_meta_single_to_ctx(trg_ctx,meta,(lyd_node *)parent_00,(lyd_meta **)0x0);
        if (LVar9 != LY_SUCCESS) goto LAB_00126737;
      }
    }
  }
  plVar5 = (parent_00->field_0).node.schema;
  if (plVar5 == (lysc_node *)0x0) {
    if ((options & 1) != 0) {
      for (plVar12 = *(lyd_node **)(node + 1); plVar12 != (lyd_node *)0x0; plVar12 = plVar12->next)
      {
        LVar9 = lyd_dup_r(plVar12,trg_ctx,(lyd_node *)parent_00,1,(lyd_node **)0x0,options,
                          (lyd_node **)0x0);
        if (LVar9 != LY_SUCCESS) {
          iVar14 = 3;
          goto joined_r0x00126730;
        }
      }
    }
    LVar9 = lydict_insert(trg_ctx,(char *)node[1].schema,0,&(parent_00->name).name);
    iVar14 = 3;
    if (((LVar9 == LY_SUCCESS) &&
        (LVar9 = lydict_insert(trg_ctx,(char *)node[1].parent,0,&(parent_00->name).prefix),
        LVar9 == LY_SUCCESS)) &&
       ((LVar9 = lydict_insert(trg_ctx,(char *)node[1].next,0,&(parent_00->name).field_2.module_ns),
        LVar9 == LY_SUCCESS &&
        (LVar9 = lydict_insert(trg_ctx,(char *)node[1].prev,0,&parent_00->value),
        LVar9 == LY_SUCCESS)))) {
      parent_00->hints = *(uint32_t *)&node[1].meta;
      LVar4 = *(LY_VALUE_FORMAT *)((long)&node[1].meta + 4);
      parent_00->format = LVar4;
      if ((node[1].priv == (void *)0x0) ||
         (LVar9 = ly_dup_prefix_data(trg_ctx,LVar4,node[1].priv,&parent_00->val_prefix_data),
         LVar9 == LY_SUCCESS)) {
        iVar14 = 0;
        LVar9 = LY_SUCCESS;
      }
    }
  }
  else {
    uVar2 = plVar5->nodetype;
    if ((uVar2 & 0xc) == 0) {
      if ((uVar2 & 0x711) == 0) {
        if ((uVar2 & 0x60) != 0) {
          (parent_00->field_0).node.hash = node->hash;
          LVar9 = lyd_any_copy_value((lyd_node *)parent_00,(lyd_any_value *)(node + 1),
                                     *(LYD_ANYDATA_VALUETYPE *)&node[1].schema);
          if (LVar9 != LY_SUCCESS) goto LAB_00126737;
        }
        goto LAB_00126751;
      }
      if ((options & 1) == 0) {
        if ((uVar2 == 0x10) && ((plVar5->flags & 0x200) == 0)) {
          plVar12 = *(lyd_node **)(node + 1);
          while ((((plVar12 != (lyd_node *)0x0 &&
                   (plVar5 = plVar12->schema, plVar5 != (lysc_node *)0x0)) &&
                  (plVar5->nodetype == 4)) && ((plVar5->flags & 0x100) != 0))) {
            LVar9 = lyd_dup_r(plVar12,trg_ctx,(lyd_node *)parent_00,1,(lyd_node **)0x0,options,
                              (lyd_node **)0x0);
            if (LVar9 != LY_SUCCESS) goto LAB_00126682;
            plVar12 = plVar12->next;
          }
        }
      }
      else {
        if (node[1].schema != (lysc_node *)0x0) {
          plVar13 = lyht_new(*(uint32_t *)(node[1].schema)->hash,8,lyd_hash_table_val_equal,
                             (void *)0x0,1);
          (parent_00->name).name = (char *)plVar13;
        }
        for (plVar12 = *(lyd_node **)(node + 1); plVar12 != (lyd_node *)0x0; plVar12 = plVar12->next
            ) {
          LVar9 = lyd_dup_r(plVar12,trg_ctx,(lyd_node *)parent_00,1,(lyd_node **)0x0,options,
                            (lyd_node **)0x0);
          if (LVar9 != LY_SUCCESS) goto LAB_00126682;
        }
      }
      lyd_hash((lyd_node *)parent_00);
    }
    else {
      (parent_00->field_0).node.hash = node->hash;
      plVar5 = node->schema;
      if (plVar5 == (lysc_node *)0x0) {
        plVar10 = (lys_module *)&node[2].schema;
      }
      else {
        plVar10 = plVar5->module;
      }
      if (trg_ctx == plVar10->ctx) {
        LVar9 = (*(code *)(node[1].schema)->parent->dsc)(trg_ctx,node + 1,&parent_00->child);
        if (LVar9 != LY_SUCCESS) {
          ly_log(trg_ctx,LY_LLERR,LVar9,"Value duplication failed.");
          goto LAB_00126682;
        }
      }
      else {
        if (plVar5 == (lysc_node *)0x0) {
          plVar12 = node[1].prev;
        }
        else {
          plVar12 = *(lyd_node **)(node + 1);
          if (plVar12 == (lyd_node *)0x0) {
            plVar12 = (lyd_node *)
                      lyd_value_get_canonical(plVar5->module->ctx,(lyd_value *)(node + 1));
          }
        }
        plVar5 = (parent_00->field_0).node.schema;
        type = plVar5[1].parent;
        sVar15 = strlen((char *)plVar12);
        LVar9 = lyd_value_store(trg_ctx,(lyd_value *)&parent_00->child,(lysc_type *)type,plVar12,
                                sVar15,'\x01','\x01',(ly_bool *)0x0,LY_VALUE_CANON,(void *)0x0,0x3f3
                                ,plVar5,(ly_bool *)0x0);
        if (LVar9 != LY_SUCCESS) {
LAB_00126682:
          iVar14 = 3;
          goto joined_r0x00126730;
        }
      }
    }
    iVar14 = 0;
    LVar9 = LY_SUCCESS;
  }
joined_r0x00126730:
  if (iVar14 == 0) {
LAB_00126751:
    lyd_insert_node(parent,first,(lyd_node *)parent_00,insert_order);
    if (dup_p == (lyd_node **)0x0) {
      return LY_SUCCESS;
    }
    *dup_p = (lyd_node *)parent_00;
    return LY_SUCCESS;
  }
  if (iVar14 != 3) {
    return LVar9;
  }
LAB_00126737:
  lyd_free_tree((lyd_node *)parent_00);
  return LVar9;
}

Assistant:

static LY_ERR
lyd_dup_r(const struct lyd_node *node, const struct ly_ctx *trg_ctx, struct lyd_node *parent, uint32_t insert_order,
        struct lyd_node **first, uint32_t options, struct lyd_node **dup_p)
{
    LY_ERR ret;
    struct lyd_node *dup = NULL;
    struct lyd_meta *meta;
    struct lyd_attr *attr;
    struct lyd_node_any *any;
    const struct lysc_type *type;
    const char *val_can;

    LY_CHECK_ARG_RET(NULL, node, LY_EINVAL);

    if (node->flags & LYD_EXT) {
        if (options & LYD_DUP_NO_EXT) {
            /* no not duplicate this subtree */
            return LY_SUCCESS;
        }

        /* we need to use the same context */
        trg_ctx = LYD_CTX(node);
    }

    if (!node->schema) {
        dup = calloc(1, sizeof(struct lyd_node_opaq));
        ((struct lyd_node_opaq *)dup)->ctx = trg_ctx;
    } else {
        switch (node->schema->nodetype) {
        case LYS_RPC:
        case LYS_ACTION:
        case LYS_NOTIF:
        case LYS_CONTAINER:
        case LYS_LIST:
            dup = calloc(1, sizeof(struct lyd_node_inner));
            break;
        case LYS_LEAF:
        case LYS_LEAFLIST:
            dup = calloc(1, sizeof(struct lyd_node_term));
            break;
        case LYS_ANYDATA:
        case LYS_ANYXML:
            dup = calloc(1, sizeof(struct lyd_node_any));
            break;
        default:
            LOGINT(trg_ctx);
            ret = LY_EINT;
            goto error;
        }
    }
    LY_CHECK_ERR_GOTO(!dup, LOGMEM(trg_ctx); ret = LY_EMEM, error);

    if (options & LYD_DUP_WITH_FLAGS) {
        dup->flags = node->flags;
    } else {
        dup->flags = (node->flags & (LYD_DEFAULT | LYD_EXT)) | LYD_NEW;
    }
    if (options & LYD_DUP_WITH_PRIV) {
        dup->priv = node->priv;
    }
    if (trg_ctx == LYD_CTX(node)) {
        dup->schema = node->schema;
    } else {
        ret = lyd_find_schema_ctx(node->schema, trg_ctx, parent, 1, &dup->schema);
        if (ret) {
            /* has no schema but is not an opaque node */
            free(dup);
            dup = NULL;
            goto error;
        }
    }
    dup->prev = dup;

    /* duplicate metadata/attributes */
    if (!(options & LYD_DUP_NO_META)) {
        if (!node->schema) {
            LY_LIST_FOR(((struct lyd_node_opaq *)node)->attr, attr) {
                LY_CHECK_GOTO(ret = lyd_dup_attr_single(attr, dup, NULL), error);
            }
        } else {
            LY_LIST_FOR(node->meta, meta) {
                LY_CHECK_GOTO(ret = lyd_dup_meta_single_to_ctx(trg_ctx, meta, dup, NULL), error);
            }
        }
    }

    /* nodetype-specific work */
    if (!dup->schema) {
        struct lyd_node_opaq *opaq = (struct lyd_node_opaq *)dup;
        struct lyd_node_opaq *orig = (struct lyd_node_opaq *)node;
        struct lyd_node *child;

        if (options & LYD_DUP_RECURSIVE) {
            /* duplicate all the children */
            LY_LIST_FOR(orig->child, child) {
                LY_CHECK_GOTO(ret = lyd_dup_r(child, trg_ctx, dup, LYD_INSERT_NODE_LAST, NULL, options, NULL), error);
            }
        }
        LY_CHECK_GOTO(ret = lydict_insert(trg_ctx, orig->name.name, 0, &opaq->name.name), error);
        LY_CHECK_GOTO(ret = lydict_insert(trg_ctx, orig->name.prefix, 0, &opaq->name.prefix), error);
        LY_CHECK_GOTO(ret = lydict_insert(trg_ctx, orig->name.module_ns, 0, &opaq->name.module_ns), error);
        LY_CHECK_GOTO(ret = lydict_insert(trg_ctx, orig->value, 0, &opaq->value), error);
        opaq->hints = orig->hints;
        opaq->format = orig->format;
        if (orig->val_prefix_data) {
            ret = ly_dup_prefix_data(trg_ctx, opaq->format, orig->val_prefix_data, &opaq->val_prefix_data);
            LY_CHECK_GOTO(ret, error);
        }
    } else if (dup->schema->nodetype & LYD_NODE_TERM) {
        struct lyd_node_term *term = (struct lyd_node_term *)dup;
        struct lyd_node_term *orig = (struct lyd_node_term *)node;

        term->hash = orig->hash;
        if (trg_ctx == LYD_CTX(node)) {
            ret = orig->value.realtype->plugin->duplicate(trg_ctx, &orig->value, &term->value);
            LY_CHECK_ERR_GOTO(ret, LOGERR(trg_ctx, ret, "Value duplication failed."), error);
        } else {
            /* store canonical value in the target context */
            val_can = lyd_get_value(node);
            type = ((struct lysc_node_leaf *)term->schema)->type;
            ret = lyd_value_store(trg_ctx, &term->value, type, val_can, strlen(val_can), 1, 1, NULL, LY_VALUE_CANON, NULL,
                    LYD_HINT_DATA, term->schema, NULL);
            LY_CHECK_GOTO(ret, error);
        }
    } else if (dup->schema->nodetype & LYD_NODE_INNER) {
        struct lyd_node_inner *orig = (struct lyd_node_inner *)node;
        struct lyd_node *child;

        if (options & LYD_DUP_RECURSIVE) {
            /* create a hash table with the size of the previous hash table (duplicate) */
            if (orig->children_ht) {
                ((struct lyd_node_inner *)dup)->children_ht = lyht_new(orig->children_ht->size, sizeof(struct lyd_node *), lyd_hash_table_val_equal, NULL, 1);
            }

            /* duplicate all the children */
            LY_LIST_FOR(orig->child, child) {
                LY_CHECK_GOTO(ret = lyd_dup_r(child, trg_ctx, dup, LYD_INSERT_NODE_LAST, NULL, options, NULL), error);
            }
        } else if ((dup->schema->nodetype == LYS_LIST) && !(dup->schema->flags & LYS_KEYLESS)) {
            /* always duplicate keys of a list */
            for (child = orig->child; child && lysc_is_key(child->schema); child = child->next) {
                LY_CHECK_GOTO(ret = lyd_dup_r(child, trg_ctx, dup, LYD_INSERT_NODE_LAST, NULL, options, NULL), error);
            }
        }
        lyd_hash(dup);
    } else if (dup->schema->nodetype & LYD_NODE_ANY) {
        dup->hash = node->hash;
        any = (struct lyd_node_any *)node;
        LY_CHECK_GOTO(ret = lyd_any_copy_value(dup, &any->value, any->value_type), error);
    }

    /* insert */
    lyd_insert_node(parent, first, dup, insert_order);

    if (dup_p) {
        *dup_p = dup;
    }
    return LY_SUCCESS;

error:
    lyd_free_tree(dup);
    return ret;
}